

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.h
# Opt level: O0

ConfigKey * ConfigKey::merge_max_files(void)

{
  ConfigKey *in_RDI;
  undefined1 *min;
  uint64_t in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  ConfigKey *in_stack_ffffffffffffffd0;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  min = &stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  ConfigKey(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
            (uint64_t)min,(uint64_t)in_RDI);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return in_RDI;
}

Assistant:

const static ConfigKey merge_max_files() {
        return ConfigKey("merge_max_files", 2 * 1024 * 1024, 1, 4294967295);
    }